

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# init.c
# Opt level: O0

void glfwInitAllocator(GLFWallocator *allocator)

{
  long *in_RDI;
  
  if (in_RDI == (long *)0x0) {
    memset(&_glfwInitAllocator,0,0x20);
  }
  else if (((*in_RDI == 0) || (in_RDI[1] == 0)) || (in_RDI[2] == 0)) {
    _glfwInputError(0x10004,"Missing function in allocator");
  }
  else {
    _glfwInitAllocator.allocate = (GLFWallocatefun)*in_RDI;
    _glfwInitAllocator.reallocate = (GLFWreallocatefun)in_RDI[1];
    _glfwInitAllocator.deallocate = (GLFWdeallocatefun)in_RDI[2];
    _glfwInitAllocator.user = (void *)in_RDI[3];
  }
  return;
}

Assistant:

GLFWAPI void glfwInitAllocator(const GLFWallocator* allocator)
{
    if (allocator)
    {
        if (allocator->allocate && allocator->reallocate && allocator->deallocate)
            _glfwInitAllocator = *allocator;
        else
            _glfwInputError(GLFW_INVALID_VALUE, "Missing function in allocator");
    }
    else
        memset(&_glfwInitAllocator, 0, sizeof(GLFWallocator));
}